

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexerScanner.cpp
# Opt level: O2

void __thiscall LexerScanner::LexerScanner(LexerScanner *this,FILE *fp)

{
  size_t __n;
  char *__ptr;
  ulong uVar1;
  long bytes;
  long fsize;
  
  (this->m_tokenText)._string._M_dataplus._M_p = (pointer)&(this->m_tokenText)._string.field_2;
  (this->m_tokenText)._string._M_string_length = 0;
  (this->m_tokenText)._string.field_2._M_local_buf[0] = '\0';
  (this->m_lastToken)._string._M_dataplus._M_p = (pointer)&(this->m_lastToken)._string.field_2;
  (this->m_lastToken)._string._M_string_length = 0;
  (this->m_lastToken)._string.field_2._M_local_buf[0] = '\0';
  this->m_line = 1;
  fseek((FILE *)fp,0,2);
  __n = ftell((FILE *)fp);
  fsize = __n;
  rewind((FILE *)fp);
  uVar1 = 0xffffffffffffffff;
  if (-2 < (long)__n) {
    uVar1 = __n + 1;
  }
  __ptr = (char *)operator_new__(uVar1);
  this->m_data = __ptr;
  this->m_lineBreakPosition = __ptr;
  this->m_position = __ptr;
  bytes = fread(__ptr,1,__n,(FILE *)fp);
  this->m_data[__n] = '\0';
  if (bytes < (long)__n) {
    error<long,long>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexerScanner.cpp:135: bytes (%1) is not at least fsize (%2)"
                     ,&bytes,&fsize);
  }
  return;
}

Assistant:

LexerScanner::LexerScanner (FILE* fp) :
	m_line (1)
{
	long fsize, bytes;

	fseek (fp, 0l, SEEK_END);
	fsize = ftell (fp);
	rewind (fp);
	m_data = new char[fsize + 1];
	m_position = m_lineBreakPosition = &m_data[0];
	bytes = fread (m_data, 1, fsize, fp);
	m_data[fsize] = '\0';
	ASSERT_GT_EQ (bytes, fsize)
}